

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_partitioned.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  void *flagvalue;
  undefined8 uVar3;
  double *pdVar4;
  void *flagvalue_00;
  void *pvVar5;
  void *pvVar6;
  char *__s1;
  char *pcVar7;
  int flag;
  SUNContext ctx;
  void *local_70;
  SUNStepper steppers [2];
  sunrealtype tret;
  void *arkode_mem;
  void *nonlinear_mem;
  void *linear_mem;
  UserData user_data;
  
  if (argc < 2) {
    __s1 = "splitting";
  }
  else {
    __s1 = argv[1];
  }
  iVar2 = strcmp(__s1,"splitting");
  if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"forcing"), iVar2 == 0)) {
    if (argc < 3) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = argv[2];
    }
    user_data.lambda = 2.0;
    flag = SUNContext_Create(0,&ctx);
    iVar2 = check_flag(&flag,"SUNContext_Create",1);
    if (iVar2 != 0) {
      return 1;
    }
    flagvalue = (void *)N_VNew_Serial(1,ctx);
    iVar2 = check_flag(flagvalue,"N_VNew_Serial",0);
    if (iVar2 != 0) {
      return 1;
    }
    N_VConst(0x3ff0000000000000,flagvalue);
    uVar3 = N_VClone(flagvalue);
    pdVar4 = (double *)N_VGetArrayPointer(flagvalue);
    dVar1 = *pdVar4;
    local_70 = (void *)((dVar1 + dVar1) / ((dVar1 + -2.0) * -7.38905609893065 + dVar1));
    pdVar4 = (double *)N_VGetArrayPointer(uVar3);
    *pdVar4 = (double)local_70;
    puts("\nAnalytical ODE test problem:");
    printf("   integrator = %s method\n",__s1);
    if (pcVar7 != (char *)0x0) {
      printf("   coefficients = %s\n",pcVar7);
    }
    printf("   lambda     = %g\n",0x4000000000000000);
    flagvalue_00 = (void *)ERKStepCreate(0,f_linear,flagvalue,ctx);
    linear_mem = flagvalue_00;
    iVar2 = check_flag(flagvalue_00,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      flag = ARKodeSetUserData(flagvalue_00,&user_data);
      iVar2 = check_flag(&flag,"ARKodeSetUserData",1);
      if (iVar2 != 0) {
        return 1;
      }
      flag = ARKodeSetFixedStep(0x3f60624dd2f1a9fc,flagvalue_00);
      iVar2 = check_flag(&flag,"ARKodeSetFixedStep",1);
      if (iVar2 != 0) {
        return 1;
      }
      pvVar5 = (void *)ARKStepCreate(0,f_nonlinear,0,flagvalue,ctx);
      nonlinear_mem = pvVar5;
      iVar2 = check_flag(pvVar5,"N_VNew_Serial",0);
      if (iVar2 == 0) {
        flag = ARKodeSetFixedStep(0x3f50624dd2f1a9fc,pvVar5);
        local_70 = pvVar5;
        iVar2 = check_flag(&flag,"ARKodeSetFixedStep",1);
        if (iVar2 != 0) {
          return 1;
        }
        ARKodeCreateSUNStepper(flagvalue_00,steppers);
        ARKodeCreateSUNStepper(local_70,steppers + 1);
        iVar2 = strcmp(__s1,"splitting");
        if (iVar2 == 0) {
          pvVar5 = (void *)SplittingStepCreate(0,steppers,2,flagvalue,ctx);
          arkode_mem = pvVar5;
          iVar2 = check_flag(pvVar5,"SplittingStepCreate",0);
          if (iVar2 != 0) {
            return 1;
          }
          if (pcVar7 != (char *)0x0) {
            pvVar6 = (void *)SplittingStepCoefficients_LoadCoefficientsByName(pcVar7);
            tret = (sunrealtype)pvVar6;
            iVar2 = check_flag(pvVar6,"SplittingStepCoefficients_LoadCoefficientsByName",0);
            if (iVar2 != 0) {
              return 1;
            }
            flag = SplittingStepSetCoefficients(pvVar5,pvVar6);
            iVar2 = check_flag(&flag,"SplittingStepSetCoefficients",1);
            if (iVar2 != 0) {
              return 1;
            }
            SplittingStepCoefficients_Destroy(&tret);
          }
        }
        else {
          pvVar5 = (void *)ForcingStepCreate(0,steppers[0],steppers[1],flagvalue,ctx);
          arkode_mem = pvVar5;
          iVar2 = check_flag(pvVar5,"ForcingStepCreate",0);
          if (iVar2 != 0) {
            return 1;
          }
        }
        flag = ARKodeSetFixedStep(0x3f847ae147ae147b,pvVar5);
        iVar2 = check_flag(&flag,"ARKodeSetFixedStep",1);
        if (iVar2 != 0) {
          return 1;
        }
        flag = ARKodeEvolve(0x3ff0000000000000,pvVar5,flagvalue,&tret,1);
        iVar2 = check_flag(&flag,"ARKodeEvolve",1);
        if (iVar2 != 0) {
          return 1;
        }
        pvVar6 = (void *)N_VClone(flagvalue);
        iVar2 = check_flag(pvVar6,"N_VClone",0);
        if (iVar2 != 0) {
          return 1;
        }
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,flagvalue,uVar3,pvVar6);
        N_VMaxNorm(pvVar6);
        printf("\nError: %g\n");
        puts("\nSplitting Stepper Statistics:");
        flag = ARKodePrintAllStats(pvVar5,_stdout,0);
        iVar2 = check_flag(&flag,"ARKodePrintAllStats",1);
        if (iVar2 != 0) {
          return 1;
        }
        puts("\nLinear Stepper Statistics:");
        flag = ARKodePrintAllStats(flagvalue_00,_stdout,0);
        iVar2 = check_flag(&flag,"ARKodePrintAllStats",1);
        if (iVar2 != 0) {
          return 1;
        }
        puts("\nNonlinear Stepper Statistics:");
        flag = ARKodePrintAllStats(local_70,_stdout,0);
        iVar2 = check_flag(&flag,"ARKodePrintAllStats",1);
        if (iVar2 == 0) {
          N_VDestroy(flagvalue);
          N_VDestroy(uVar3);
          N_VDestroy(pvVar6);
          ARKodeFree(&linear_mem);
          SUNStepper_Destroy(steppers);
          ARKodeFree(&nonlinear_mem);
          SUNStepper_Destroy(steppers + 1);
          ARKodeFree(&arkode_mem);
          SUNContext_Free(&ctx);
          return 0;
        }
        return 1;
      }
    }
  }
  else {
    fprintf(_stderr,"Invalid integrator: %s\nMust be \'splitting\' or \'forcing\'\n",__s1);
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  /* Parse arguments */
  const char* integrator_name = (argc > 1) ? argv[1] : "splitting";
  if (strcmp(integrator_name, "splitting") != 0 &&
      strcmp(integrator_name, "forcing") != 0)
  {
    fprintf(stderr, "Invalid integrator: %s\nMust be 'splitting' or 'forcing'\n",
            integrator_name);
    return 1;
  }
  char* coefficients_name = (argc > 2) ? argv[2] : NULL;

  /* Problem parameters */
  sunrealtype t0           = SUN_RCONST(0.0);  /* initial time */
  sunrealtype tf           = SUN_RCONST(1.0);  /* final time */
  sunrealtype dt           = SUN_RCONST(0.01); /* outer time step */
  sunrealtype dt_linear    = dt / 5;           /* linear integrator time step */
  sunrealtype dt_nonlinear = dt / 10; /* nonlinear integrator time step */

  UserData user_data = {.lambda = SUN_RCONST(2.0)};

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  int flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initialize vector with initial condition */
  N_Vector y = N_VNew_Serial(1, ctx);
  if (check_flag(y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(1.0), y);

  N_Vector y_exact = exact_sol(y, tf, &user_data);

  printf("\nAnalytical ODE test problem:\n");
  printf("   integrator = %s method\n", integrator_name);
  if (coefficients_name != NULL)
  {
    printf("   coefficients = %s\n", coefficients_name);
  }
  printf("   lambda     = %" GSYM "\n", user_data.lambda);

  /* Create the integrator for the linear partition */
  void* linear_mem = ERKStepCreate(f_linear, t0, y, ctx);
  if (check_flag(linear_mem, "N_VNew_Serial", 0)) { return 1; }

  flag = ARKodeSetUserData(linear_mem, &user_data);
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }

  flag = ARKodeSetFixedStep(linear_mem, dt_linear);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create the integrator for the nonlinear partition */
  void* nonlinear_mem = ARKStepCreate(f_nonlinear, NULL, t0, y, ctx);
  if (check_flag(nonlinear_mem, "N_VNew_Serial", 0)) { return 1; }

  flag = ARKodeSetFixedStep(nonlinear_mem, dt_nonlinear);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create SUNSteppers out of the integrators */
  SUNStepper steppers[2];
  ARKodeCreateSUNStepper(linear_mem, &steppers[0]);
  ARKodeCreateSUNStepper(nonlinear_mem, &steppers[1]);

  /* Create the outer integrator */
  void* arkode_mem;
  if (strcmp(integrator_name, "splitting") == 0)
  {
    arkode_mem = SplittingStepCreate(steppers, 2, t0, y, ctx);
    if (check_flag(arkode_mem, "SplittingStepCreate", 0)) { return 1; }

    if (coefficients_name != NULL)
    {
      SplittingStepCoefficients coefficients =
        SplittingStepCoefficients_LoadCoefficientsByName(coefficients_name);
      if (check_flag(coefficients,
                     "SplittingStepCoefficients_LoadCoefficientsByName", 0))
      {
        return 1;
      }

      flag = SplittingStepSetCoefficients(arkode_mem, coefficients);
      if (check_flag(&flag, "SplittingStepSetCoefficients", 1)) { return 1; }

      SplittingStepCoefficients_Destroy(&coefficients);
    }
  }
  else
  {
    arkode_mem = ForcingStepCreate(steppers[0], steppers[1], t0, y, ctx);
    if (check_flag(arkode_mem, "ForcingStepCreate", 0)) { return 1; }
  }

  flag = ARKodeSetFixedStep(arkode_mem, dt);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Compute the numerical solution */
  sunrealtype tret;
  flag = ARKodeEvolve(arkode_mem, tf, y, &tret, ARK_NORMAL);
  if (check_flag(&flag, "ARKodeEvolve", 1)) { return 1; }

  /* Print the numerical error and statistics */
  N_Vector y_err = N_VClone(y);
  if (check_flag(y_err, "N_VClone", 0)) { return 1; }
  N_VLinearSum(SUN_RCONST(1.0), y, -SUN_RCONST(1.0), y_exact, y_err);
  printf("\nError: %" GSYM "\n", N_VMaxNorm(y_err));

  printf("\nSplitting Stepper Statistics:\n");
  flag = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  printf("\nLinear Stepper Statistics:\n");
  flag = ARKodePrintAllStats(linear_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  printf("\nNonlinear Stepper Statistics:\n");
  flag = ARKodePrintAllStats(nonlinear_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  /* Free memory */
  N_VDestroy(y);
  N_VDestroy(y_exact);
  N_VDestroy(y_err);
  ARKodeFree(&linear_mem);
  SUNStepper_Destroy(&steppers[0]);
  ARKodeFree(&nonlinear_mem);
  SUNStepper_Destroy(&steppers[1]);
  ARKodeFree(&arkode_mem);
  SUNContext_Free(&ctx);

  return 0;
}